

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>::
findBucketWithHash<QStringView>
          (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *this,
          QStringView *key,size_t hash)

{
  ulong uVar1;
  Span *pSVar2;
  long lVar3;
  long lVar4;
  QStringView rhs;
  bool bVar5;
  ulong uVar6;
  Span *pSVar7;
  Span *pSVar8;
  ulong uVar9;
  Bucket BVar10;
  QStringView lhs;
  
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  uVar9 = uVar1 - 1 & hash;
  pSVar7 = pSVar2 + (uVar9 >> 7);
  uVar9 = (ulong)((uint)uVar9 & 0x7f);
  lVar3 = key->m_size;
  rhs = *key;
  do {
    uVar6 = (ulong)pSVar7->offsets[uVar9];
    if (uVar6 == 0xff) {
LAB_003a80f4:
      bVar5 = false;
    }
    else {
      lVar4 = *(long *)pSVar7->entries[uVar6].storage.data;
      if (lVar4 == lVar3) {
        lhs.m_data = *(storage_type_conflict **)(pSVar7->entries[uVar6].storage.data + 8);
        lhs.m_size = lVar4;
        bVar5 = QtPrivate::equalStrings(lhs,rhs);
        if (bVar5) goto LAB_003a80f4;
      }
      uVar9 = uVar9 + 1;
      bVar5 = true;
      if (uVar9 == 0x80) {
        pSVar8 = pSVar7 + 1;
        pSVar7 = pSVar2;
        if (((long)pSVar8 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (uVar1 >> 7) != 0) {
          pSVar7 = pSVar8;
        }
        uVar9 = 0;
      }
    }
    if (!bVar5) {
      BVar10.index = uVar9;
      BVar10.span = pSVar7;
      return BVar10;
    }
  } while( true );
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }